

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O3

uint __thiscall
llvm::DWARFVerifier::verifyNameIndexCompleteness(DWARFVerifier *this,DWARFDie *Die,NameIndex *NI)

{
  Tag TVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  NameIndex *pNVar4;
  undefined8 uVar5;
  undefined1 uVar6;
  DWARFDie *this_00;
  uint uVar7;
  uint uVar8;
  DWARFAbbreviationDeclaration *pDVar9;
  uint64_t uVar10;
  raw_ostream *this_01;
  uint64_t uVar11;
  ulong uVar12;
  undefined1 auVar13 [8];
  undefined1 in_R8B;
  bool bVar14;
  StringRef Fmt;
  Optional<unsigned_long> OVar15;
  ArrayRef<llvm::dwarf::Attribute> Attrs;
  undefined1 local_d58 [16];
  undefined1 local_d48 [184];
  bool local_c90;
  _Alloc_hider local_c80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c70 [2];
  undefined **local_c48;
  undefined8 local_c40;
  undefined1 local_c30 [160];
  bool local_b90;
  _Alloc_hider local_b80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b70;
  undefined1 local_b58 [16];
  OptionalStorage<llvm::DWARFDebugNames::Entry,_false> local_b48;
  uint64_t local_a88;
  _Alloc_hider local_a80;
  size_type local_a78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a70;
  OptionalStorage<unsigned_int,_true> local_a60;
  NameIndex *local_a58;
  undefined1 local_a50;
  undefined **local_a48 [3];
  undefined1 local_a30 [160];
  bool local_990;
  uint64_t local_988;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_980;
  size_type local_978;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_970;
  OptionalStorage<unsigned_int,_true> local_960;
  undefined1 local_958 [16];
  OptionalStorage<llvm::DWARFDebugNames::Entry,_false> local_948;
  uint64_t local_888;
  _Alloc_hider local_880;
  size_type local_878;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_870;
  OptionalStorage<unsigned_int,_true> local_860;
  NameIndex *local_858;
  undefined1 local_850;
  undefined **local_848 [3];
  undefined1 local_830 [160];
  bool local_790;
  uint64_t local_788;
  long *local_780 [2];
  long local_770 [2];
  OptionalStorage<unsigned_int,_true> local_760;
  NameIndex *local_758;
  undefined1 local_750;
  undefined **local_748 [3];
  undefined1 local_730 [160];
  bool local_690;
  uint64_t local_688;
  long *local_680;
  long local_678;
  long local_670 [2];
  OptionalStorage<unsigned_int,_true> local_660;
  NameIndex *local_658;
  undefined1 local_650;
  undefined **local_648 [3];
  undefined1 local_630 [160];
  bool local_590;
  uint64_t local_588;
  long *local_580;
  long local_578;
  long local_570 [2];
  OptionalStorage<unsigned_int,_true> local_560;
  undefined1 local_558 [8];
  SmallVector<llvm::StringRef,_2U> EntryNames;
  undefined **local_518 [3];
  undefined1 local_500 [160];
  bool local_460;
  uint64_t local_458;
  long *local_450;
  long local_448;
  long local_440 [2];
  OptionalStorage<unsigned_int,_true> local_430;
  NameIndex *local_428;
  undefined1 local_420;
  undefined **local_418 [3];
  undefined1 local_400 [160];
  bool local_360;
  uint64_t local_358;
  long *local_350;
  long local_348;
  long local_340 [2];
  OptionalStorage<unsigned_int,_true> local_330;
  undefined1 local_328 [8];
  StringRef *local_320;
  OptionalStorage<llvm::DWARFDebugNames::Entry,_false> local_318;
  uint64_t local_258;
  long *local_250 [2];
  long local_240 [2];
  OptionalStorage<unsigned_int,_true> local_230;
  undefined1 local_228 [16];
  OptionalStorage<llvm::DWARFDebugNames::Entry,_false> local_218;
  uint64_t local_158;
  _Alloc_hider local_150;
  size_type local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  OptionalStorage<unsigned_int,_true> local_130;
  string *local_128;
  StringRef *local_120;
  string *local_118;
  string *local_110;
  string *local_108;
  string *local_100;
  string *local_f8;
  string *local_f0;
  DWARFDie *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  StringRef *local_c8;
  NameIndex *local_c0;
  _func_int **local_b8;
  undefined **local_b0;
  undefined1 auStack_a8 [8];
  StringRef Name;
  
  DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_d58,Die,DW_AT_declaration);
  if ((bool)local_d48[0x20] != false) {
    return 0;
  }
  pDVar9 = DWARFDie::getAbbreviationDeclarationPtr(Die);
  if ((pDVar9 == (DWARFAbbreviationDeclaration *)0x0) ||
     (bVar14 = true, pDVar9->Tag != DW_TAG_subprogram)) {
    pDVar9 = DWARFDie::getAbbreviationDeclarationPtr(Die);
    if (pDVar9 == (DWARFAbbreviationDeclaration *)0x0) {
      bVar14 = false;
    }
    else {
      bVar14 = pDVar9->Tag == DW_TAG_inlined_subroutine;
    }
  }
  getNames((SmallVector<llvm::StringRef,_2U> *)local_558,Die,bVar14);
  uVar8 = 0;
  if ((uint)EntryNames.super_SmallVectorImpl<llvm::StringRef>.
            super_SmallVectorTemplateBase<llvm::StringRef,_true>.
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX == 0
     ) goto LAB_00d849b3;
  pDVar9 = DWARFDie::getAbbreviationDeclarationPtr(Die);
  if (pDVar9 != (DWARFAbbreviationDeclaration *)0x0) {
    TVar1 = pDVar9->Tag;
    if (TVar1 < DW_TAG_inlined_subroutine) {
      switch(TVar1) {
      case DW_TAG_imported_declaration:
      case DW_TAG_member:
      case DW_TAG_compile_unit:
        goto LAB_00d849b3;
      case DW_TAG_imported_declaration|DW_TAG_array_type:
      case DW_TAG_lexical_block:
      case DW_TAG_imported_declaration|DW_TAG_enumeration_type:
      case DW_TAG_imported_declaration|DW_TAG_enumeration_type|DW_TAG_class_type:
      case DW_TAG_pointer_type:
      case DW_TAG_reference_type:
        break;
      case DW_TAG_label:
LAB_00d83e6d:
        local_328 = (undefined1  [8])0x52005500120011;
        Attrs.Length = 4;
        Attrs.Data = (Attribute *)local_328;
        DWARFDie::findRecursively((Optional<llvm::DWARFFormValue> *)local_d58,Die,Attrs);
        if ((bool)local_d48[0x20] == false) goto LAB_00d849b3;
        break;
      default:
        if (TVar1 == DW_TAG_formal_parameter) goto LAB_00d849b3;
      }
    }
    else {
      uVar7 = (uint)TVar1;
      if (uVar7 < 0x35) {
        uVar12 = (ulong)uVar7;
        if ((0x1810040000000U >> (uVar12 & 0x3f) & 1) != 0) goto LAB_00d849b3;
        if ((0x400020000000U >> (uVar12 & 0x3f) & 1) != 0) goto LAB_00d83e6d;
        if (uVar12 == 0x34) {
          bVar14 = isVariableIndexable(Die,this->DCtx);
          if (!bVar14) goto LAB_00d849b3;
          goto LAB_00d83ebc;
        }
      }
      if (uVar7 - 0x4106 < 2) goto LAB_00d849b3;
    }
  }
LAB_00d83ebc:
  uVar10 = DWARFDie::getOffset(Die);
  if ((ulong)(uint)EntryNames.super_SmallVectorImpl<llvm::StringRef>.
                   super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                   super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                   BeginX != 0) {
    uVar2 = (Die->U->Header).Offset;
    local_c8 = (StringRef *)
               ((long)local_558 +
               (ulong)(uint)EntryNames.super_SmallVectorImpl<llvm::StringRef>.
                            super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                            super_SmallVectorBase.BeginX * 0x10);
    local_118 = (string *)&local_580;
    local_110 = (string *)&local_350;
    local_108 = (string *)&local_680;
    local_100 = (string *)&local_450;
    local_f0 = (string *)local_780;
    local_f8 = (string *)&local_150;
    local_128 = (string *)local_250;
    local_d8 = &local_870;
    local_d0 = &local_a70;
    local_e0 = local_c70;
    local_c0 = (NameIndex *)&PTR_anchor_01078d48;
    local_b8 = (_func_int **)&PTR_anchor_01077d78;
    local_b0 = &PTR_anchor_01078920;
    uVar8 = 0;
    auVar13 = local_558;
    local_e8 = Die;
    do {
      auStack_a8 = (undefined1  [8])((StringRef *)auVar13)->Data;
      Name.Data = (char *)((StringRef *)auVar13)->Length;
      local_120 = (StringRef *)auVar13;
      DWARFDebugNames::NameIndex::equal_range
                ((iterator_range<llvm::DWARFDebugNames::ValueIterator> *)local_d58,NI,
                 *(StringRef *)auVar13);
      iterator_range<llvm::DWARFDebugNames::ValueIterator>::begin
                ((ValueIterator *)local_b58,
                 (iterator_range<llvm::DWARFDebugNames::ValueIterator> *)local_d58);
      iterator_range<llvm::DWARFDebugNames::ValueIterator>::end
                ((ValueIterator *)local_958,
                 (iterator_range<llvm::DWARFDebugNames::ValueIterator> *)local_d58);
      local_658 = (NameIndex *)local_b58._0_8_;
      local_650 = local_b58[8];
      optional_detail::OptionalStorage<llvm::DWARFDebugNames::Entry,_false>::OptionalStorage
                ((OptionalStorage<llvm::DWARFDebugNames::Entry,_false> *)local_648,&local_b48);
      local_588 = local_a88;
      local_580 = local_570;
      std::__cxx11::string::_M_construct<char*>(local_118,local_a80._M_p,local_a80._M_p + local_a78)
      ;
      local_560 = local_a60;
      local_428 = (NameIndex *)local_958._0_8_;
      local_420 = local_958[8];
      optional_detail::OptionalStorage<llvm::DWARFDebugNames::Entry,_false>::OptionalStorage
                ((OptionalStorage<llvm::DWARFDebugNames::Entry,_false> *)local_418,&local_948);
      local_358 = local_888;
      local_350 = local_340;
      std::__cxx11::string::_M_construct<char*>(local_110,local_880._M_p,local_880._M_p + local_878)
      ;
      local_330 = local_860;
      local_758 = local_658;
      local_750 = local_650;
      optional_detail::OptionalStorage<llvm::DWARFDebugNames::Entry,_false>::OptionalStorage
                ((OptionalStorage<llvm::DWARFDebugNames::Entry,_false> *)local_748,
                 (OptionalStorage<llvm::DWARFDebugNames::Entry,_false> *)local_648);
      local_688 = local_588;
      local_680 = local_670;
      std::__cxx11::string::_M_construct<char*>(local_108,local_580,local_578 + (long)local_580);
      uVar6 = local_420;
      local_660 = local_560;
      EntryNames.super_SmallVectorStorage<llvm::StringRef,_2U>.InlineElts[1].buffer._8_8_ =
           local_428;
      optional_detail::OptionalStorage<llvm::DWARFDebugNames::Entry,_false>::OptionalStorage
                ((OptionalStorage<llvm::DWARFDebugNames::Entry,_false> *)local_518,
                 (OptionalStorage<llvm::DWARFDebugNames::Entry,_false> *)local_418);
      local_458 = local_358;
      local_450 = local_440;
      std::__cxx11::string::_M_construct<char*>(local_100,local_350,local_348 + (long)local_350);
      local_430 = local_330;
      local_228._0_8_ = local_758;
      local_228[8] = (bool)local_750;
      optional_detail::OptionalStorage<llvm::DWARFDebugNames::Entry,_false>::OptionalStorage
                (&local_218,(OptionalStorage<llvm::DWARFDebugNames::Entry,_false> *)local_748);
      local_158 = local_688;
      local_150._M_p = (pointer)&local_140;
      std::__cxx11::string::_M_construct<char*>(local_f8,local_680,local_678 + (long)local_680);
      local_130 = local_660;
      local_858 = (NameIndex *)
                  EntryNames.super_SmallVectorStorage<llvm::StringRef,_2U>.InlineElts[1].buffer.
                  _8_8_;
      local_850 = uVar6;
      optional_detail::OptionalStorage<llvm::DWARFDebugNames::Entry,_false>::OptionalStorage
                ((OptionalStorage<llvm::DWARFDebugNames::Entry,_false> *)local_848,
                 (OptionalStorage<llvm::DWARFDebugNames::Entry,_false> *)local_518);
      local_788 = local_458;
      local_780[0] = local_770;
      std::__cxx11::string::_M_construct<char*>(local_f0,local_450,local_448 + (long)local_450);
      local_760 = local_430;
      while (((NameIndex *)local_228._0_8_ != local_858 || (local_158 != local_788))) {
        local_320 = (StringRef *)CONCAT71(local_320._1_7_,local_228[8]);
        local_328 = (undefined1  [8])local_228._0_8_;
        optional_detail::OptionalStorage<llvm::DWARFDebugNames::Entry,_false>::OptionalStorage
                  (&local_318,&local_218);
        local_258 = local_158;
        local_250[0] = local_240;
        std::__cxx11::string::_M_construct<char*>
                  (local_128,local_150._M_p,local_150._M_p + local_148);
        local_230 = local_130;
        if (local_318.hasVal == false) {
          __assert_fail("hasVal",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                        ,0x4d,
                        "const T &llvm::optional_detail::OptionalStorage<llvm::DWARFDebugNames::Entry>::getValue() const & [T = llvm::DWARFDebugNames::Entry]"
                       );
        }
        OVar15 = DWARFDebugNames::Entry::getDIEUnitOffset((Entry *)&local_318);
        if (local_250[0] != local_240) {
          operator_delete(local_250[0],local_240[0] + 1);
        }
        if (local_318.hasVal == true) {
          local_318.field_0.value.super_Entry._vptr_Entry =
               (_func_int **)&PTR___cxa_pure_virtual_01077f88;
          if ((void *)CONCAT62(local_318.field_0._10_6_,local_318.field_0._8_2_) !=
              (void *)((long)&local_318.field_0 + 0x18)) {
            free((void *)CONCAT62(local_318.field_0._10_6_,local_318.field_0._8_2_));
          }
          local_318.hasVal = false;
        }
        if ((OVar15.Storage.hasVal & OVar15.Storage.field_0.value == uVar10 - uVar2) != 0) break;
        DWARFDebugNames::ValueIterator::next((ValueIterator *)local_228);
      }
      local_a50 = local_228[8];
      local_a58 = (NameIndex *)local_228._0_8_;
      optional_detail::OptionalStorage<llvm::DWARFDebugNames::Entry,_false>::OptionalStorage
                ((OptionalStorage<llvm::DWARFDebugNames::Entry,_false> *)local_a48,&local_218);
      local_988 = local_158;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_p == &local_140) {
        local_970._8_8_ = local_140._8_8_;
        local_980 = &local_970;
      }
      else {
        local_980 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_150._M_p;
      }
      local_970._M_allocated_capacity._1_7_ = local_140._M_allocated_capacity._1_7_;
      local_970._M_local_buf[0] = local_140._M_local_buf[0];
      local_978 = local_148;
      local_148 = 0;
      local_140._M_local_buf[0] = '\0';
      local_960 = local_130;
      local_150._M_p = (pointer)&local_140;
      if (local_780[0] != local_770) {
        operator_delete(local_780[0],local_770[0] + 1);
      }
      if (local_790 == true) {
        local_848[0] = &PTR___cxa_pure_virtual_01077f88;
        if (local_848[1] != (undefined **)local_830) {
          free(local_848[1]);
        }
        local_790 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_p != &local_140) {
        operator_delete(local_150._M_p,
                        CONCAT71(local_140._M_allocated_capacity._1_7_,local_140._M_local_buf[0]) +
                        1);
      }
      if ((local_218.hasVal == true) &&
         (local_218.field_0.value.super_Entry._vptr_Entry =
               (_func_int **)&PTR___cxa_pure_virtual_01077f88,
         (undefined1 *)
         local_218.field_0.value.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
         super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
         super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX !=
         (undefined1 *)((long)&local_218.field_0 + 0x18))) {
        free(local_218.field_0.value.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
             super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
             super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.
             BeginX);
      }
      if (local_450 != local_440) {
        operator_delete(local_450,local_440[0] + 1);
      }
      if (local_460 == true) {
        local_518[0] = &PTR___cxa_pure_virtual_01077f88;
        if (local_518[1] != (undefined **)local_500) {
          free(local_518[1]);
        }
        local_460 = false;
      }
      if (local_680 != local_670) {
        operator_delete(local_680,local_670[0] + 1);
      }
      if ((local_690 == true) &&
         (local_748[0] = &PTR___cxa_pure_virtual_01077f88, local_748[1] != (undefined **)local_730))
      {
        free(local_748[1]);
      }
      uVar11 = local_888;
      uVar5 = local_958._0_8_;
      uVar3 = local_988;
      pNVar4 = local_a58;
      if (local_980 != &local_970) {
        operator_delete(local_980,local_970._M_allocated_capacity + 1);
      }
      if (local_990 == true) {
        local_a48[0] = &PTR___cxa_pure_virtual_01077f88;
        if (local_a48[1] != (undefined **)local_a30) {
          free(local_a48[1]);
        }
        local_990 = false;
      }
      if (local_350 != local_340) {
        operator_delete(local_350,local_340[0] + 1);
      }
      if (local_360 == true) {
        local_418[0] = &PTR___cxa_pure_virtual_01077f88;
        if (local_418[1] != (undefined **)local_400) {
          free(local_418[1]);
        }
        local_360 = false;
      }
      if (local_580 != local_570) {
        operator_delete(local_580,local_570[0] + 1);
      }
      if ((local_590 == true) &&
         (local_648[0] = &PTR___cxa_pure_virtual_01077f88, local_648[1] != (undefined **)local_630))
      {
        free(local_648[1]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_880._M_p != local_d8) {
        operator_delete(local_880._M_p,local_870._M_allocated_capacity + 1);
      }
      if (local_948.hasVal == true) {
        local_948.field_0.value.super_Entry._vptr_Entry =
             (_func_int **)&PTR___cxa_pure_virtual_01077f88;
        if ((undefined1 *)
            local_948.field_0.value.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
            super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
            super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX
            != (undefined1 *)((long)&local_948.field_0 + 0x18)) {
          free(local_948.field_0.value.super_Entry.Values.
               super_SmallVectorImpl<llvm::DWARFFormValue>.
               super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
               super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.
               BeginX);
        }
        local_948.hasVal = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a80._M_p != local_d0) {
        operator_delete(local_a80._M_p,local_a70._M_allocated_capacity + 1);
      }
      if ((local_b48.hasVal == true) &&
         (local_b48.field_0.value.super_Entry._vptr_Entry =
               (_func_int **)&PTR___cxa_pure_virtual_01077f88,
         (undefined1 *)
         local_b48.field_0.value.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
         super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
         super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX !=
         (undefined1 *)((long)&local_b48.field_0 + 0x18))) {
        free(local_b48.field_0.value.super_Entry.Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
             super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
             super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.
             BeginX);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b80._M_p != &local_b70) {
        operator_delete(local_b80._M_p,local_b70._M_allocated_capacity + 1);
      }
      this_00 = local_e8;
      if (local_b90 == true) {
        local_c48 = &PTR___cxa_pure_virtual_01077f88;
        if ((undefined1 *)local_c40 != local_c30) {
          free((void *)local_c40);
        }
        local_b90 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c80._M_p != local_e0) {
        operator_delete(local_c80._M_p,local_c70[0]._M_allocated_capacity + 1);
      }
      if ((local_c90 == true) &&
         (local_d48._0_8_ = &PTR___cxa_pure_virtual_01077f88,
         (SmallVectorStorage<llvm::DWARFFormValue,_3U> *)local_d48._8_8_ !=
         &(((anon_union_184_2_fc7899a5_for_OptionalStorage<llvm::DWARFDebugNames::Entry,_false>_2 *)
           local_d48)->value).super_Entry.Values.super_SmallVectorStorage<llvm::DWARFFormValue,_3U>)
         ) {
        free((void *)local_d48._8_8_);
      }
      if (uVar11 == uVar3 && (NameIndex *)uVar5 == pNVar4) {
        this_01 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xe67796,
                                   (StringRef)ZEXT816(0),(bool)in_R8B);
        uVar3 = NI->Base;
        uVar11 = DWARFDie::getOffset(this_00);
        pDVar9 = DWARFDie::getAbbreviationDeclarationPtr(this_00);
        if (pDVar9 == (DWARFAbbreviationDeclaration *)0x0) {
          local_318.field_0._8_2_ = DW_TAG_null;
        }
        else {
          local_318.field_0._8_2_ = pDVar9->Tag;
        }
        local_328 = (undefined1  [8])local_c0;
        local_320 = (StringRef *)auStack_a8;
        local_318.field_0.value.super_Entry._vptr_Entry = local_b8;
        local_318.field_0._16_8_ = local_b0;
        local_318.field_0._32_8_ = local_b0;
        Fmt.Length = 0x47;
        Fmt.Data = "Name Index @ {0:x}: Entry for DIE @ {1:x} ({2}) with name {3} missing.\n";
        local_318.field_0._24_8_ = uVar11;
        local_318.field_0._40_8_ = uVar3;
        formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<llvm::dwarf::Tag>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>_>
        ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<llvm::dwarf::Tag>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>_>
                          *)local_d58,Fmt,
                         (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<llvm::dwarf::Tag>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>
                          *)local_328);
        raw_ostream::operator<<(this_01,(formatv_object_base *)local_d58);
        if ((DWARFContext *)local_d48._24_8_ != (DWARFContext *)0x0) {
          operator_delete((void *)local_d48._24_8_,local_d48._40_8_ - local_d48._24_8_);
        }
        if ((_func_int **)local_d48._0_8_ != (_func_int **)0x0) {
          operator_delete((void *)local_d48._0_8_,local_d48._16_8_ - local_d48._0_8_);
        }
        uVar8 = uVar8 + 1;
      }
      auVar13 = (undefined1  [8])(local_120 + 1);
    } while (auVar13 != (undefined1  [8])local_c8);
  }
LAB_00d849b3:
  if (local_558 !=
      (undefined1  [8])
      &EntryNames.super_SmallVectorImpl<llvm::StringRef>.
       super_SmallVectorTemplateBase<llvm::StringRef,_true>.
       super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size) {
    free((void *)local_558);
  }
  return uVar8;
}

Assistant:

unsigned DWARFVerifier::verifyNameIndexCompleteness(
    const DWARFDie &Die, const DWARFDebugNames::NameIndex &NI) {

  // First check, if the Die should be indexed. The code follows the DWARF v5
  // wording as closely as possible.

  // "All non-defining declarations (that is, debugging information entries
  // with a DW_AT_declaration attribute) are excluded."
  if (Die.find(DW_AT_declaration))
    return 0;

  // "DW_TAG_namespace debugging information entries without a DW_AT_name
  // attribute are included with the name “(anonymous namespace)”.
  // All other debugging information entries without a DW_AT_name attribute
  // are excluded."
  // "If a subprogram or inlined subroutine is included, and has a
  // DW_AT_linkage_name attribute, there will be an additional index entry for
  // the linkage name."
  auto IncludeLinkageName = Die.getTag() == DW_TAG_subprogram ||
                            Die.getTag() == DW_TAG_inlined_subroutine;
  auto EntryNames = getNames(Die, IncludeLinkageName);
  if (EntryNames.empty())
    return 0;

  // We deviate from the specification here, which says:
  // "The name index must contain an entry for each debugging information entry
  // that defines a named subprogram, label, variable, type, or namespace,
  // subject to ..."
  // Instead whitelisting all TAGs representing a "type" or a "subprogram", to
  // make sure we catch any missing items, we instead blacklist all TAGs that we
  // know shouldn't be indexed.
  switch (Die.getTag()) {
  // Compile units and modules have names but shouldn't be indexed.
  case DW_TAG_compile_unit:
  case DW_TAG_module:
    return 0;

  // Function and template parameters are not globally visible, so we shouldn't
  // index them.
  case DW_TAG_formal_parameter:
  case DW_TAG_template_value_parameter:
  case DW_TAG_template_type_parameter:
  case DW_TAG_GNU_template_parameter_pack:
  case DW_TAG_GNU_template_template_param:
    return 0;

  // Object members aren't globally visible.
  case DW_TAG_member:
    return 0;

  // According to a strict reading of the specification, enumerators should not
  // be indexed (and LLVM currently does not do that). However, this causes
  // problems for the debuggers, so we may need to reconsider this.
  case DW_TAG_enumerator:
    return 0;

  // Imported declarations should not be indexed according to the specification
  // and LLVM currently does not do that.
  case DW_TAG_imported_declaration:
    return 0;

  // "DW_TAG_subprogram, DW_TAG_inlined_subroutine, and DW_TAG_label debugging
  // information entries without an address attribute (DW_AT_low_pc,
  // DW_AT_high_pc, DW_AT_ranges, or DW_AT_entry_pc) are excluded."
  case DW_TAG_subprogram:
  case DW_TAG_inlined_subroutine:
  case DW_TAG_label:
    if (Die.findRecursively(
            {DW_AT_low_pc, DW_AT_high_pc, DW_AT_ranges, DW_AT_entry_pc}))
      break;
    return 0;

  // "DW_TAG_variable debugging information entries with a DW_AT_location
  // attribute that includes a DW_OP_addr or DW_OP_form_tls_address operator are
  // included; otherwise, they are excluded."
  //
  // LLVM extension: We also add DW_OP_GNU_push_tls_address to this list.
  case DW_TAG_variable:
    if (isVariableIndexable(Die, DCtx))
      break;
    return 0;

  default:
    break;
  }

  // Now we know that our Die should be present in the Index. Let's check if
  // that's the case.
  unsigned NumErrors = 0;
  uint64_t DieUnitOffset = Die.getOffset() - Die.getDwarfUnit()->getOffset();
  for (StringRef Name : EntryNames) {
    if (none_of(NI.equal_range(Name), [&](const DWARFDebugNames::Entry &E) {
          return E.getDIEUnitOffset() == DieUnitOffset;
        })) {
      error() << formatv("Name Index @ {0:x}: Entry for DIE @ {1:x} ({2}) with "
                         "name {3} missing.\n",
                         NI.getUnitOffset(), Die.getOffset(), Die.getTag(),
                         Name);
      ++NumErrors;
    }
  }
  return NumErrors;
}